

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.h
# Opt level: O0

BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)49,_(mp::expr::Kind)49>
 mp::internal::
 UncheckedCast<mp::BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)49,(mp::expr::Kind)49>>
           (Expr e)

{
  Impl *in_RDI;
  BasicExpr<(mp::expr::Kind)49,_(mp::expr::Kind)49> *basic;
  BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)49,_(mp::expr::Kind)49>
  expr;
  BasicExpr<(mp::expr::Kind)49,_(mp::expr::Kind)49> *local_20;
  BasicExpr<(mp::expr::Kind)49,_(mp::expr::Kind)49> *local_18;
  ExprBase local_10;
  BasicExpr<(mp::expr::Kind)49,_(mp::expr::Kind)49> local_8;
  
  local_10.impl_ = in_RDI;
  BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)49,_(mp::expr::Kind)49>
  ::BasicUnaryExpr((BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)49,_(mp::expr::Kind)49>
                    *)0x2b9303);
  local_20 = &local_8;
  local_18 = local_20;
  Unused<mp::BasicExpr<(mp::expr::Kind)49,(mp::expr::Kind)49>*>(&local_20);
  return (BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)49,_(mp::expr::Kind)49>
          )local_10.impl_;
}

Assistant:

inline ExprType internal::UncheckedCast(Expr e) {
  MP_ASSERT(Is<ExprType>(e.kind()), "invalid cast");
  ExprType expr;
  // Make sure that ExprType is a subclass or an instance of BasicExpr.
  BasicExpr<static_cast<expr::Kind>(ExprType::FIRST_KIND),
            static_cast<expr::Kind>(ExprType::LAST_KIND)> &basic = expr;
  internal::Unused(&basic);
  expr.impl_ = e.impl_;
  return expr;
}